

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_api.c
# Opt level: O0

MPP_RET hal_vp8d_init(void *hal,MppHalCfg *cfg)

{
  RK_U32 RVar1;
  int local_34;
  RK_U32 hw_flag;
  VpuHwMode hw_mode;
  MppHalApi *p_api;
  VP8DHalContext_t *self;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  local_34 = 0;
  if (hal == (void *)0x0) {
    hal_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    mpp_env_get_u32("hal_vp8d_debug",&hal_vp8d_debug,0);
    memset(hal,0,0xb0);
    RVar1 = mpp_get_vcodec_type();
    if ((RVar1 & 1) != 0) {
      local_34 = 2;
    }
    if ((RVar1 & 2) != 0) {
      local_34 = 4;
    }
    if (local_34 == 2) {
      *(code **)((long)hal + 0x70) = hal_vp8d_vdpu1_init;
      *(code **)((long)hal + 0x78) = hal_vp8d_vdpu1_deinit;
      *(code **)((long)hal + 0x80) = hal_vp8d_vdpu1_gen_regs;
      *(code **)((long)hal + 0x88) = hal_vp8d_vdpu1_start;
      *(code **)((long)hal + 0x90) = hal_vp8d_vdpu1_wait;
      *(undefined8 *)((long)hal + 0x98) = 0;
      *(undefined8 *)((long)hal + 0xa0) = 0;
      *(undefined8 *)((long)hal + 0xa8) = 0;
    }
    else {
      if (local_34 != 4) {
        return MPP_ERR_INIT;
      }
      *(code **)((long)hal + 0x70) = hal_vp8d_vdpu2_init;
      *(code **)((long)hal + 0x78) = hal_vp8d_vdpu2_deinit;
      *(code **)((long)hal + 0x80) = hal_vp8d_vdpu2_gen_regs;
      *(code **)((long)hal + 0x88) = hal_vp8d_vdpu2_start;
      *(code **)((long)hal + 0x90) = hal_vp8d_vdpu2_wait;
      *(undefined8 *)((long)hal + 0x98) = 0;
      *(undefined8 *)((long)hal + 0xa0) = 0;
      *(undefined8 *)((long)hal + 0xa8) = 0;
    }
    hal_local._4_4_ = (**(code **)((long)hal + 0x70))(hal,cfg);
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_vp8d_init(void *hal, MppHalCfg *cfg)
{
    VP8DHalContext_t *self = (VP8DHalContext_t *)hal;
    MppHalApi *p_api = NULL;
    VpuHwMode hw_mode = MODE_NULL;
    RK_U32 hw_flag = 0;

    if (NULL == self)
        return MPP_ERR_VALUE;

    mpp_env_get_u32("hal_vp8d_debug", &hal_vp8d_debug, 0);

    memset(self, 0, sizeof(VP8DHalContext_t));
    p_api = &self->hal_api;

    hw_flag = mpp_get_vcodec_type();
    if (hw_flag & HAVE_VDPU1)
        hw_mode = VDPU1_MODE;
    if (hw_flag & HAVE_VDPU2)
        hw_mode = VDPU2_MODE;

    switch (hw_mode) {
    case VDPU2_MODE:
        p_api->init = hal_vp8d_vdpu2_init;
        p_api->deinit = hal_vp8d_vdpu2_deinit;
        p_api->reg_gen = hal_vp8d_vdpu2_gen_regs;
        p_api->start = hal_vp8d_vdpu2_start;
        p_api->wait = hal_vp8d_vdpu2_wait;
        p_api->reset = NULL;
        p_api->flush = NULL;
        p_api->control = NULL;
        break;
    case VDPU1_MODE:
        p_api->init = hal_vp8d_vdpu1_init;
        p_api->deinit = hal_vp8d_vdpu1_deinit;
        p_api->reg_gen = hal_vp8d_vdpu1_gen_regs;
        p_api->start = hal_vp8d_vdpu1_start;
        p_api->wait = hal_vp8d_vdpu1_wait;
        p_api->reset = NULL;
        p_api->flush = NULL;
        p_api->control = NULL;
        break;
    default:
        return MPP_ERR_INIT;
        break;
    }

    return p_api->init (hal, cfg);
}